

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O0

type __thiscall
PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)2>
          (Memory *this,Source segment,uint16_t offset)

{
  uint32_t address;
  uint32_t high_address;
  uint32_t physical_address;
  uint16_t offset_local;
  Source segment_local;
  Memory *this_local;
  
  address = Memory::address(this,segment,offset);
  if (offset == 0xffff) {
    high_address = Memory::address(this,segment,0);
    this_local = (Memory *)split_word<(InstructionSet::x86::AccessType)2>(this,address,high_address)
    ;
  }
  else {
    this_local = (Memory *)access<unsigned_short,(InstructionSet::x86::AccessType)2>(this,address);
  }
  return (type)this_local;
}

Assistant:

typename InstructionSet::x86::Accessor<IntT, type>::type access(InstructionSet::x86::Source segment, uint16_t offset) {
			const uint32_t physical_address = address(segment, offset);

			if constexpr (std::is_same_v<IntT, uint16_t>) {
				// If this is a 16-bit access that runs past the end of the segment, it'll wrap back
				// to the start. So the 16-bit value will need to be a local cache.
				if(offset == 0xffff) {
					return split_word<type>(physical_address, address(segment, 0));
				}
			}

			return access<IntT, type>(physical_address);
		}